

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Member.cpp
# Opt level: O2

void __thiscall Member::Member(Member *this,Member *anotherMember)

{
  int iVar1;
  
  this->_vptr_Member = (_func_int **)&PTR__Member_0010bcc8;
  (this->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->memberList).super__Vector_base<MemberListEntry,_std::allocator<MemberListEntry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->myPos)._M_current = (MemberListEntry *)0x0;
  std::queue<q_elt,std::deque<q_elt,std::allocator<q_elt>>>::
  queue<std::deque<q_elt,std::allocator<q_elt>>,void>(&this->mp1q);
  *(undefined2 *)((this->addr).addr + 4) = *(undefined2 *)((anotherMember->addr).addr + 4);
  *(undefined4 *)(this->addr).addr = *(undefined4 *)(anotherMember->addr).addr;
  this->inited = anotherMember->inited;
  this->inGroup = anotherMember->inGroup;
  this->bFailed = anotherMember->bFailed;
  this->nnb = anotherMember->nnb;
  this->heartbeat = anotherMember->heartbeat;
  iVar1 = anotherMember->timeOutCounter;
  this->pingCounter = anotherMember->pingCounter;
  this->timeOutCounter = iVar1;
  std::vector<MemberListEntry,_std::allocator<MemberListEntry>_>::operator=
            (&this->memberList,&anotherMember->memberList);
  (this->myPos)._M_current = (anotherMember->myPos)._M_current;
  std::deque<q_elt,_std::allocator<q_elt>_>::operator=(&(this->mp1q).c,&(anotherMember->mp1q).c);
  return;
}

Assistant:

Member::Member(const Member &anotherMember) {
	this->addr = anotherMember.addr;
	this->inited = anotherMember.inited;
	this->inGroup = anotherMember.inGroup;
	this->bFailed = anotherMember.bFailed;
	this->nnb = anotherMember.nnb;
	this->heartbeat = anotherMember.heartbeat;
	this->pingCounter = anotherMember.pingCounter;
	this->timeOutCounter = anotherMember.timeOutCounter;
	this->memberList = anotherMember.memberList;
	this->myPos = anotherMember.myPos;
	this->mp1q = anotherMember.mp1q;
}